

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execCmp<(moira::Instr)37,(moira::Mode)2,(moira::Size)2>(Moira *this,u16 opcode)

{
  ushort uVar1;
  bool bVar2;
  u32 uVar3;
  ulong in_RAX;
  long lVar4;
  u32 data;
  u32 ea;
  undefined8 local_18;
  
  local_18 = in_RAX;
  bVar2 = readOp<(moira::Mode)2,(moira::Size)2,0ul>
                    (this,opcode & 7,(u32 *)((long)&local_18 + 4),(u32 *)&local_18);
  if (bVar2) {
    uVar1 = *(ushort *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x58);
    lVar4 = (ulong)uVar1 - (local_18 & 0xffffffff);
    (this->reg).sr.c = (bool)((byte)((ulong)lVar4 >> 0x10) & 1);
    (this->reg).sr.v =
         (bool)((byte)((((uint)local_18 ^ uVar1) & ((uint)lVar4 ^ (uint)uVar1)) >> 0xf) & 1);
    (this->reg).sr.z = (short)lVar4 == 0;
    (this->reg).sr.n = (bool)((byte)((uint)lVar4 >> 0xf) & 1);
    uVar3 = (this->reg).pc;
    (this->reg).pc0 = uVar3;
    (this->queue).ird = (this->queue).irc;
    uVar3 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar3 + 2);
    (this->queue).irc = (u16)uVar3;
  }
  return;
}

Assistant:

void
Moira::execCmp(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;

    cmp<S>(data, readD<S>(dst));
    prefetch<POLLIPL>();

    if (S == Long) sync(2);
}